

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TreeConvert(InnerMap *this,size_type b)

{
  bool bVar1;
  Arena *arena;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  LogMessage *pLVar5;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  size_type local_88;
  size_type count;
  less<google::protobuf::MapKey> local_71;
  Tree *local_70;
  Tree *tree;
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  size_type b_local;
  InnerMap *this_local;
  
  local_18 = b;
  b_local = (size_type)this;
  bVar1 = TableEntryIsTree(this,b);
  local_51 = 0;
  if ((bVar1) || (bVar1 = TableEntryIsTree(this,local_18 ^ 1), bVar1)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x3db);
    local_51 = 1;
    pLVar5 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: !TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&tree + 3),pLVar5);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  arena = internal::MapAllocator<void_*>::arena(&this->alloc_);
  internal::
  MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>::
  MapAllocator<void*>((MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>
                       *)&count,&this->alloc_);
  local_70 = Arena::
             Create<std::map<std::reference_wrapper<google::protobuf::MapKey_const>,void*,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>,std::less<google::protobuf::MapKey>,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<google::protobuf::MapKey_const>const,void*>>>
                       (arena,&local_71,
                        (MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>
                         *)&count);
  sVar2 = CopyListToTree(this,local_18,local_70);
  sVar3 = CopyListToTree(this,local_18 ^ 1,local_70);
  local_88 = sVar2 + sVar3;
  sVar4 = std::
          map<std::reference_wrapper<const_google::protobuf::MapKey>,_void_*,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
          ::size(local_70);
  local_c1 = 0;
  if (sVar2 + sVar3 != sVar4) {
    internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x3e0);
    local_c1 = 1;
    pLVar5 = internal::LogMessage::operator<<(&local_c0,"CHECK failed: (count) == (tree->size()): ")
    ;
    internal::LogFinisher::operator=(&local_c2,pLVar5);
  }
  if ((local_c1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_c0);
  }
  this->table_[local_18 ^ 1] = local_70;
  this->table_[local_18] = local_70;
  return;
}

Assistant:

void TreeConvert(size_type b) {
      GOOGLE_DCHECK(!TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1));
      Tree* tree =
          Arena::Create<Tree>(alloc_.arena(), typename Tree::key_compare(),
                              typename Tree::allocator_type(alloc_));
      size_type count = CopyListToTree(b, tree) + CopyListToTree(b ^ 1, tree);
      GOOGLE_DCHECK_EQ(count, tree->size());
      table_[b] = table_[b ^ 1] = static_cast<void*>(tree);
    }